

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

void __thiscall
QVariant::setValue<QIBusAttribute_const&,void>(QVariant *this,QIBusAttribute *avalue)

{
  undefined1 *puVar1;
  ulong uVar2;
  PrivateShared *pPVar3;
  bool bVar4;
  QIBusAttribute *this_00;
  long in_FS_OFFSET;
  QMetaType local_48;
  anon_union_24_3_e3d07ef4_for_data local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIBusAttribute>::metaType;
  uVar2 = *(ulong *)&(this->d).field_0x18;
  if (((uVar2 & 1) == 0) || (*(int *)(this->d).data.shared == 1)) {
    local_40.shared = (PrivateShared *)(uVar2 & 0xfffffffffffffffc);
    bVar4 = comparesEqual((QMetaType *)&local_40.shared,&local_48);
    if (bVar4) {
      this_00 = (QIBusAttribute *)this;
      if (((this->d).field_0x18 & 1) != 0) {
        pPVar3 = (this->d).data.shared;
        this_00 = (QIBusAttribute *)(pPVar3 + *(int *)(pPVar3 + 4));
      }
      QIBusAttribute::operator=(this_00,avalue);
      puVar1 = &(this->d).field_0x18;
      *puVar1 = *puVar1 & 0xfd;
      goto LAB_0011a574;
    }
  }
  fromValue<QIBusAttribute>
            ((enable_if_t<std::is_copy_constructible_v<QIBusAttribute>_&&_std::is_destructible_v<QIBusAttribute>,_QVariant>
              *)&local_40,avalue);
  operator=(this,(QVariant *)&local_40);
  QVariant::~QVariant((QVariant *)&local_40);
LAB_0011a574:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setValue(T &&avalue)
    {
        using VT = std::decay_t<T>;
        QMetaType metaType = QMetaType::fromType<VT>();
        // If possible we reuse the current QVariant private.
        if (isDetached() && d.type() == metaType) {
            *reinterpret_cast<VT *>(const_cast<void *>(constData())) = std::forward<T>(avalue);
            d.is_null = false;
        } else {
            *this = QVariant::fromValue<VT>(std::forward<T>(avalue));
        }
    }